

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void calc_rate_dist_block_param
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int calculate_rd,int *early_term,
               BLOCK_SIZE bsize,uint sse)

{
  int in_ECX;
  undefined4 *in_RDX;
  int *in_R8;
  int in_stack_00000008;
  int bh;
  int bw;
  undefined4 in_stack_00000028;
  undefined4 in_stack_00000054;
  int64_t *in_stack_00000058;
  
  if (in_ECX != 0) {
    if (*in_R8 == 0) {
      model_rd_with_curvfit
                (cpi,x,rd_stats._7_1_,(int)rd_stats,CONCAT44(calculate_rd,in_stack_00000028),
                 early_term._4_4_,(int *)CONCAT44(in_stack_00000054,sse),in_stack_00000058);
    }
    if (*in_R8 != 0) {
      *in_RDX = 0;
      *(ulong *)(in_RDX + 2) = (ulong)(uint)(in_stack_00000008 << 4);
    }
  }
  return;
}

Assistant:

static inline void calc_rate_dist_block_param(AV1_COMP *cpi, MACROBLOCK *x,
                                              RD_STATS *rd_stats,
                                              int calculate_rd, int *early_term,
                                              BLOCK_SIZE bsize,
                                              unsigned int sse) {
  if (calculate_rd) {
    if (!*early_term) {
      const int bw = block_size_wide[bsize];
      const int bh = block_size_high[bsize];

      model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, rd_stats->sse, bw * bh,
                            &rd_stats->rate, &rd_stats->dist);
    }

    if (*early_term) {
      rd_stats->rate = 0;
      rd_stats->dist = sse << 4;
    }
  }
}